

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testoverlay.c
# Opt level: O2

void ConvertRGBtoYUY2(SDL_Surface *s,SDL_Overlay *o,int monochrome,int luminance)

{
  Uint8 *pUVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  Uint8 *rgb;
  int yuv [3];
  int local_44;
  Uint8 local_40;
  Uint8 local_3c;
  ulong local_38;
  
  SDL_LockSurface();
  SDL_LockYUVOverlay(o);
  uVar3 = 0;
  while ((iVar2 = (int)uVar3, iVar2 < s->h && (iVar2 < o->h))) {
    rgb = (Uint8 *)((ulong)((uint)s->pitch * iVar2) + (long)s->pixels);
    uVar5 = (uint)*o->pitches * iVar2;
    pUVar1 = *o->pixels;
    local_38 = uVar3;
    for (uVar4 = 0; ((int)uVar4 < s->w && ((int)uVar4 < o->w)); uVar4 = uVar4 + 1) {
      RGBtoYUV(rgb,&local_44,monochrome,luminance);
      if ((uVar4 & 1) == 0) {
        pUVar1[uVar4 * 2 + (ulong)uVar5 + 1] = local_40;
        pUVar1[uVar4 * 2 + (ulong)uVar5 + 3] = local_3c;
      }
      pUVar1[uVar4 * 2 + (ulong)uVar5] = (Uint8)local_44;
      rgb = rgb + s->format->BytesPerPixel;
    }
    uVar3 = (ulong)((int)local_38 + 1);
  }
  SDL_UnlockYUVOverlay(o);
  SDL_UnlockSurface(s);
  return;
}

Assistant:

void ConvertRGBtoYUY2(SDL_Surface *s, SDL_Overlay *o, int monochrome, int luminance)
{
	int x,y;
	int yuv[3];
	Uint8 *p,*op;

	SDL_LockSurface(s);
	SDL_LockYUVOverlay(o);

	for(y=0; y<s->h && y<o->h; y++)
	{
		p=((Uint8 *) s->pixels)+s->pitch*y;
		op=o->pixels[0]+o->pitches[0]*y;
		for(x=0; x<s->w && x<o->w; x++)
		{
			RGBtoYUV(p,yuv, monochrome, luminance);
			if(x%2==0)
			{
				*(op++)=yuv[0];
				*(op++)=yuv[1];
				op[1]=yuv[2];
			}
			else
			{
				*op=yuv[0];
				op+=2;
			}

			p+=s->format->BytesPerPixel;
		}
	}

	SDL_UnlockYUVOverlay(o);
	SDL_UnlockSurface(s);
}